

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool P_TryMove(AActor *thing,DVector2 *pos,int dropoff,secplane_t *onfloor,FCheckPosition *tm,
              bool missileCheck)

{
  long lVar1;
  DVector2 *pDVar2;
  side_t *src;
  bool bVar3;
  bool bVar4;
  unsigned_short uVar5;
  int iVar6;
  uint uVar7;
  DBot *pDVar8;
  DBot *pDVar9;
  AActor *pAVar10;
  ASectorAction *pAVar11;
  sector_t *psVar12;
  spechit_t *psVar13;
  double dVar14;
  double dVar15;
  double local_4d0;
  byte local_4a9;
  bool local_471;
  spechit_t *spec_2;
  FName local_43c;
  TFlags<ActorFlag2,_unsigned_int> local_438;
  uint local_434;
  undefined1 local_430 [4];
  int numSpecHitTemp;
  Self local_428;
  Self local_424;
  DVector3 local_420;
  TVector2<double> local_408;
  DVector3 local_3f8;
  TVector3<double> local_3e0;
  DVector3 local_3c8;
  undefined1 local_3b0 [8];
  DVector3 oldpos;
  FLinkContext ctx_3;
  double fakez;
  double eyez_1;
  sector_t_conflict *hs;
  TFlags<ActorFlag2,_unsigned_int> local_368;
  TFlags<ActorFlag6,_unsigned_int> local_364;
  line_t_conflict *local_360;
  line_t *ld_2;
  undefined1 local_340 [8];
  DVector2 lastpos;
  spechit_t spec_1;
  TFlags<ActorFlag,_unsigned_int> local_300;
  TFlags<ActorFlag2,_unsigned_int> local_2fc;
  undefined1 local_2f8 [8];
  FLinkContext ctx_2;
  DVector3a hit;
  divline_t dl1_1;
  FLinkContext ctx_1;
  TVector2<double> local_290;
  undefined1 local_280 [8];
  DVector2 thingpos;
  DVector3 oldthingpos;
  undefined1 local_248 [8];
  DVector3 pos_1;
  TVector2<double> local_218;
  undefined1 local_208 [8];
  FLinkContext ctx;
  FLinePortal *port;
  line_t *ld_1;
  double frac;
  divline_t dl1;
  undefined1 local_1b0 [24];
  divline_t dl2;
  line_t *ld;
  spechit_t *spec;
  uint i;
  int besthitnum;
  spechit_t besthit;
  double bestfrac;
  Self local_130;
  undefined1 local_12c [3];
  bool portalcrossed;
  TFlags<ActorFlag,_unsigned_int> local_128;
  TFlags<ActorBounceFlag,_unsigned_short> local_122;
  double local_120;
  double eyez;
  double viewheight;
  Self local_108;
  bool oldAboveFakeCeiling;
  bool oldAboveFakeFloor;
  Self local_100;
  TFlags<ActorFlag2,_unsigned_int> local_fc;
  Self local_f8;
  Self local_f4;
  TFlags<ActorFlag2,_unsigned_int> local_f0;
  TFlags<ActorFlag2,_unsigned_int> local_ec;
  double local_e8;
  double floorz;
  TFlags<ActorFlag5,_unsigned_int> local_d8;
  undefined1 local_d4 [4];
  TFlags<ActorFlag,_unsigned_int> local_d0;
  TFlags<ActorFlag,_unsigned_int> local_cc;
  TFlags<ActorFlag4,_unsigned_int> local_c8;
  TFlags<ActorBounceFlag,_unsigned_short> local_c2;
  TFlags<ActorFlag6,_unsigned_int> local_c0;
  byte local_b9;
  double dStack_b8;
  bool good;
  double savedz;
  TFlags<ActorFlag,_unsigned_int> local_a8;
  TFlags<ActorFlag3,_unsigned_int> local_a4;
  TFlags<ActorFlag,_unsigned_int> local_a0;
  TFlags<ActorFlag,_unsigned_int> local_9c;
  TFlags<ActorFlag2,_unsigned_int> local_98;
  TFlags<ActorFlag,_unsigned_int> local_94;
  TFlags<ActorFlag2,_unsigned_int> local_90;
  TFlags<ActorFlag3,_unsigned_int> local_8c;
  TFlags<ActorFlag,_unsigned_int> local_88;
  TFlags<ActorFlag,_unsigned_int> local_84;
  TFlags<ActorFlag3,_unsigned_int> local_80;
  TFlags<ActorFlag3,_unsigned_int> local_7c;
  Self local_78;
  TFlags<ActorFlag2,_unsigned_int> local_74;
  AActor *local_70;
  AActor *BlockingMobj;
  sector_t_conflict *newsec;
  sector_t_conflict *oldsec;
  int oldside;
  int side;
  double oldz;
  sector_t_conflict *oldsector;
  FCheckPosition *pFStack_38;
  bool missileCheck_local;
  FCheckPosition *tm_local;
  secplane_t *onfloor_local;
  DVector2 *pDStack_20;
  int dropoff_local;
  DVector2 *pos_local;
  AActor *thing_local;
  
  newsec = (sector_t_conflict *)thing->Sector;
  tm->floatok = false;
  tm->portalstep = false;
  oldsector._7_1_ = missileCheck;
  pFStack_38 = tm;
  tm_local = (FCheckPosition *)onfloor;
  onfloor_local._4_4_ = dropoff;
  pDStack_20 = pos;
  pos_local = (DVector2 *)thing;
  _oldside = AActor::Z(thing);
  pDVar2 = pos_local;
  if (tm_local != (FCheckPosition *)0x0) {
    dVar14 = secplane_t::ZatPoint((secplane_t *)tm_local,pDStack_20);
    AActor::SetZ((AActor *)pDVar2,dVar14,true);
  }
  TFlags<ActorFlag6,_unsigned_int>::operator|=
            ((TFlags<ActorFlag6,_unsigned_int> *)(pos_local + 0x1d),MF6_INTRYMOVE);
  bVar3 = P_CheckPosition((AActor *)pos_local,pDStack_20,pFStack_38,false);
  if (!bVar3) {
    local_70 = (AActor *)pos_local[0x35].X;
    if ((((local_70 != (AActor *)0x0) && (local_70->player == (player_t *)0x0)) &&
        (pos_local[0x23].X != 0.0)) &&
       ((local_70->player == (player_t *)0x0 && (pos_local[0x23].X != 0.0)))) {
      dVar14 = AActor::Top(local_70);
      dVar15 = AActor::Z((AActor *)pos_local);
      if (dVar14 - dVar15 < pos_local[0x3f].X || dVar14 - dVar15 == pos_local[0x3f].X) {
        dVar14 = secplane_t::ZatPoint(&local_70->Sector->ceilingplane,pDStack_20);
        dVar15 = AActor::Top(local_70);
        if (((pos_local[0x18].X <= dVar14 - dVar15) ||
            (bVar3 = sector_t::PortalBlocksMovement(local_70->Sector,1), !bVar3)) &&
           (dVar14 = pFStack_38->ceilingz, dVar15 = AActor::Top(local_70),
           pos_local[0x18].X <= dVar14 - dVar15)) {
          TFlags<ActorFlag2,_unsigned_int>::operator&
                    (&local_74,(int)pFStack_38->thing + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
          uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
          local_471 = uVar7 == 0 || (i_compatflags & 0x10U) != 0;
          if (local_471) {
            AActor::SetZ((AActor *)pos_local,_oldside,true);
            operator~((EnumType)&local_78);
            TFlags<ActorFlag6,_unsigned_int>::operator&=
                      ((TFlags<ActorFlag6,_unsigned_int> *)(pos_local + 0x1d),&local_78);
            return false;
          }
          goto LAB_00582d65;
        }
      }
    }
    goto LAB_00584a08;
  }
LAB_00582d65:
  TFlags<ActorFlag3,_unsigned_int>::operator&
            (&local_7c,
             (int)pos_local + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
  uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_7c);
  if (uVar7 == 0) {
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_80,
               (int)pos_local + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
    uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_80);
    if (uVar7 != 0) {
      AActor::SetZ((AActor *)pos_local,pFStack_38->ceilingz - pos_local[0x18].X,true);
    }
  }
  else {
    AActor::SetZ((AActor *)pos_local,pFStack_38->floorz,true);
  }
  if ((tm_local != (FCheckPosition *)0x0) &&
     (pFStack_38->floorsector == (sector_t *)pos_local[0x15].Y)) {
    AActor::SetZ((AActor *)pos_local,pFStack_38->floorz,true);
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_84,
             (int)pos_local +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_84);
  if (uVar7 == 0) {
    if (pos_local[0x18].X <= pFStack_38->ceilingz - pFStack_38->floorz) {
      pFStack_38->floatok = true;
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_88,
                 (int)pos_local +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_88);
      bVar3 = false;
      if (uVar7 == 0) {
        dVar14 = pFStack_38->ceilingz;
        dVar15 = AActor::Top((AActor *)pos_local);
        bVar3 = false;
        if (dVar14 < dVar15) {
          TFlags<ActorFlag3,_unsigned_int>::operator&
                    (&local_8c,
                     (int)pos_local +
                     (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
          uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_8c);
          bVar3 = false;
          if (uVar7 == 0) {
            TFlags<ActorFlag2,_unsigned_int>::operator&
                      (&local_90,(int)pos_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
            uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_90);
            bVar3 = true;
            if (uVar7 != 0) {
              TFlags<ActorFlag,_unsigned_int>::operator&
                        (&local_94,
                         (int)pos_local +
                         (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
              uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_94);
              bVar3 = uVar7 == 0;
            }
          }
        }
      }
      if (!bVar3) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_98,(int)pos_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_98);
        bVar3 = false;
        if (uVar7 != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_9c,
                     (int)pos_local +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_9c);
          bVar3 = uVar7 != 0;
        }
        if ((!bVar3) ||
           (dVar14 = AActor::Top((AActor *)pos_local),
           dVar14 < pFStack_38->ceilingz || dVar14 == pFStack_38->ceilingz)) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_a0,
                     (int)pos_local +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_a0);
          bVar3 = false;
          if (uVar7 == 0) {
            TFlags<ActorFlag3,_unsigned_int>::operator&
                      (&local_a4,
                       (int)pos_local +
                       (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
            uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_a4);
            bVar3 = uVar7 == 0;
          }
          if (bVar3) {
            TFlags<ActorFlag,_unsigned_int>::operator&
                      (&local_a8,
                       (int)pos_local +
                       (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
            uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_a8);
            bVar3 = false;
            if (uVar7 != 0) {
              TFlags<ActorFlag6,_unsigned_int>::operator&
                        ((TFlags<ActorFlag6,_unsigned_int> *)((long)&savedz + 4),
                         (int)pos_local +
                         (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
              uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&savedz + 4));
              bVar3 = false;
              if (uVar7 == 0) {
                dVar14 = pFStack_38->floorz;
                dVar15 = AActor::Z((AActor *)pos_local);
                bVar3 = dVar15 < dVar14;
              }
            }
            if ((bVar3) ||
               (dVar14 = pFStack_38->floorz, dVar15 = AActor::Z((AActor *)pos_local),
               dVar14 = dVar14 - dVar15, pos_local[0x3f].X <= dVar14 && dVar14 != pos_local[0x3f].X)
               ) goto LAB_00584a08;
            dVar14 = AActor::Z((AActor *)pos_local);
            if (dVar14 < pFStack_38->floorz) {
              dStack_b8 = AActor::Z((AActor *)pos_local);
              AActor::SetZ((AActor *)pos_local,pFStack_38->floorz,true);
              local_b9 = P_TestMobjZ((AActor *)pos_local,true,(AActor **)0x0);
              AActor::SetZ((AActor *)pos_local,dStack_b8,true);
              if ((local_b9 & 1) == 0) goto LAB_00584a08;
              TFlags<ActorFlag6,_unsigned_int>::operator&
                        (&local_c0,
                         (int)pos_local +
                         (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
              uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_c0);
              if ((uVar7 != 0) &&
                 (AActor::SetZ((AActor *)pos_local,pFStack_38->floorz,true),
                 pos_local[0xd].Y <= 0.0 && pos_local[0xd].Y != 0.0)) {
                TFlags<ActorBounceFlag,_unsigned_short>::operator&
                          (&local_c2,
                           (int)pos_local +
                           (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|
                           BOUNCE_Actors));
                uVar5 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_c2);
                if (uVar5 == 0) {
                  pos_local[0xd].Y = 0.0;
                }
                else {
                  AActor::FloorBounceMissile
                            ((AActor *)pos_local,&pFStack_38->floorsector->floorplane);
                }
              }
            }
          }
          bVar3 = false;
          if ((i_compatflags & 0x100000U) != 0) {
            TFlags<ActorFlag4,_unsigned_int>::operator&
                      (&local_c8,
                       (int)pos_local +
                       (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
            uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_c8);
            bVar3 = uVar7 == 0;
          }
          if (bVar3) {
            onfloor_local._4_4_ = 0;
          }
          if (onfloor_local._4_4_ == 2) {
            if ((pFStack_38->floorz - pFStack_38->dropoffz <= 128.0) &&
               (bVar3 = TObjPtr<AActor>::operator==
                                  ((TObjPtr<AActor> *)&pos_local[0x20].Y,(AActor *)0x0), !bVar3)) {
              pAVar10 = TObjPtr<AActor>::operator->((TObjPtr<AActor> *)&pos_local[0x20].Y);
              dVar14 = AActor::Z(pAVar10);
              if (dVar14 < pFStack_38->dropoffz || dVar14 == pFStack_38->dropoffz)
              goto LAB_005833b9;
            }
            onfloor_local._4_4_ = 0;
          }
LAB_005833b9:
          if (onfloor_local._4_4_ == 0) {
            pDVar2 = pos_local + 0x1b;
            operator|((EnumType)local_d4,MF_DROPOFF);
            TFlags<ActorFlag,_unsigned_int>::operator|(&local_d0,(ActorFlag)local_d4);
            TFlags<ActorFlag,_unsigned_int>::operator&(&local_cc,(Self *)((long)&pDVar2->Y + 4));
            uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_cc);
            bVar3 = true;
            if (uVar7 != 0) goto LAB_00583433;
          }
          else {
LAB_00583433:
            TFlags<ActorFlag5,_unsigned_int>::operator&
                      (&local_d8,
                       (int)pos_local +
                       (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF
                       ));
            uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_d8);
            bVar3 = uVar7 != 0;
          }
          if (bVar3) {
            TFlags<ActorFlag5,_unsigned_int>::operator&
                      ((TFlags<ActorFlag5,_unsigned_int> *)((long)&floorz + 4),
                       (int)pos_local +
                       (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF
                       ));
            uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&floorz + 4));
            if (uVar7 == 0) {
              local_e8 = pFStack_38->floorz;
              TFlags<ActorFlag2,_unsigned_int>::operator&
                        (&local_ec,(int)pos_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
              uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_ec);
              if (uVar7 != 0) {
                dVar14 = AActor::Z((AActor *)pos_local);
                local_e8 = MAX<double>(dVar14,pFStack_38->floorz);
              }
              dVar14 = local_e8 - pFStack_38->dropoffz;
              local_4a9 = 0;
              if (pos_local[0x3e].Y <= dVar14 && dVar14 != pos_local[0x3e].Y) {
                TFlags<ActorFlag2,_unsigned_int>::operator&
                          (&local_f0,(int)pos_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
                uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f0);
                local_4a9 = 0;
                if (uVar7 == 0) {
                  local_4a9 = oldsector._7_1_ ^ 0xff;
                }
              }
              if ((local_4a9 & 1) != 0) {
                AActor::SetZ((AActor *)pos_local,_oldside,true);
                operator~((EnumType)&local_f4);
                TFlags<ActorFlag6,_unsigned_int>::operator&=
                          ((TFlags<ActorFlag6,_unsigned_int> *)(pos_local + 0x1d),&local_f4);
                return false;
              }
            }
            else {
              dVar14 = pos_local[0x14].X - pFStack_38->floorz;
              if ((pos_local[0x3e].Y <= dVar14 && dVar14 != pos_local[0x3e].Y) ||
                 (dVar14 = pos_local[0x15].X - pFStack_38->dropoffz,
                 pos_local[0x3e].Y <= dVar14 && dVar14 != pos_local[0x3e].Y)) {
                operator~((EnumType)&local_f8);
                TFlags<ActorFlag6,_unsigned_int>::operator&=
                          ((TFlags<ActorFlag6,_unsigned_int> *)(pos_local + 0x1d),&local_f8);
                return false;
              }
            }
          }
          TFlags<ActorFlag2,_unsigned_int>::operator&
                    (&local_fc,(int)pos_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
          uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_fc);
          bVar3 = false;
          if (uVar7 != 0) {
            bVar4 = FTextureID::operator!=(&pFStack_38->floorpic,(FTextureID *)(pos_local + 0x16));
            bVar3 = true;
            if (!bVar4) {
              dVar14 = pFStack_38->floorz;
              dVar15 = AActor::Z((AActor *)pos_local);
              bVar3 = dVar14 - dVar15 != 0.0;
            }
          }
          if (bVar3) {
            AActor::SetZ((AActor *)pos_local,_oldside,true);
            operator~((EnumType)&local_100);
            TFlags<ActorFlag6,_unsigned_int>::operator&=
                      ((TFlags<ActorFlag6,_unsigned_int> *)(pos_local + 0x1d),&local_100);
            return false;
          }
          bVar3 = false;
          if (pos_local[0x23].X != 0.0) {
            bVar4 = TObjPtr<DBot>::operator!=
                              ((TObjPtr<DBot> *)((long)pos_local[0x23].X + 0x198),(DBot *)0x0);
            bVar3 = false;
            if (bVar4) {
              TFlags<ActorFlag,_unsigned_int>::operator&
                        ((TFlags<ActorFlag,_unsigned_int> *)&stack0xfffffffffffffefc,
                         (int)pos_local +
                         (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
              uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&stack0xfffffffffffffefc);
              bVar3 = uVar7 != 0;
            }
          }
          if (((bVar3) && (pFStack_38->sector != (sector_t *)pos_local[0x13].X)) &&
             (bVar3 = FCajunMaster::IsDangerous(&bglobal,pFStack_38->sector), bVar3)) {
            pDVar8 = TObjPtr<DBot>::operator->((TObjPtr<DBot> *)((long)pos_local[0x23].X + 0x198));
            pDVar9 = TObjPtr<DBot>::operator->((TObjPtr<DBot> *)((long)pos_local[0x23].X + 0x198));
            (pDVar9->prev).field_0 = (pDVar8->dest).field_0;
            pDVar8 = TObjPtr<DBot>::operator->((TObjPtr<DBot> *)((long)pos_local[0x23].X + 0x198));
            TObjPtr<AActor>::operator=(&pDVar8->dest,(AActor *)0x0);
            pos_local[0xd].X = 0.0;
            pos_local[0xc].Y = 0.0;
            AActor::SetZ((AActor *)pos_local,_oldside,true);
            operator~((EnumType)&local_108);
            TFlags<ActorFlag6,_unsigned_int>::operator&=
                      ((TFlags<ActorFlag6,_unsigned_int> *)(pos_local + 0x1d),&local_108);
            return false;
          }
          goto LAB_005838c6;
        }
      }
    }
LAB_00584a08:
    operator~((EnumType)&local_428);
    TFlags<ActorFlag6,_unsigned_int>::operator&=
              ((TFlags<ActorFlag6,_unsigned_int> *)(pos_local + 0x1d),&local_428);
    if ((pos_local[0x23].X == 0.0) || ((*(uint *)((long)pos_local[0x23].X + 0xe8) & 0x2000) == 0)) {
      AActor::SetZ((AActor *)pos_local,_oldside,true);
      pDVar2 = pos_local + 0x1b;
      operator|((EnumType)local_430,MF_TELEPORT);
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)&numSpecHitTemp,(Self *)((long)&pDVar2->Y + 4));
      uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&numSpecHitTemp);
      if (uVar7 == 0) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_438,(int)pFStack_38->thing + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_438);
        if (uVar7 != 0) {
          pAVar10 = pFStack_38->thing;
          iVar6 = pFStack_38->thing->Mass;
          FName::FName(&local_43c,NAME_Melee);
          TAngle<double>::TAngle((TAngle<double> *)&spec_2,0.0);
          P_DamageMobj(pAVar10,(AActor *)0x0,(AActor *)0x0,iVar6 >> 5,&local_43c,0,(DAngle *)&spec_2
                      );
        }
        local_434 = TArray<spechit_t,_spechit_t>::Size(&spechit);
        while (0 < (int)local_434) {
          local_434 = local_434 - 1;
          psVar13 = TArray<spechit_t,_spechit_t>::operator[](&spechit,(long)(int)local_434);
          oldsec._4_4_ = P_PointOnLineSide(&psVar13->Refpos,(line_t_conflict *)psVar13->line);
          CheckForPushSpecial(psVar13->line,oldsec._4_4_,(AActor *)pos_local,&psVar13->Refpos);
        }
      }
      thing_local._7_1_ = false;
    }
    else {
      thing_local._7_1_ = false;
    }
  }
  else {
LAB_005838c6:
    if (pos_local[0x23].X == 0.0) {
      local_4d0 = pos_local[0x18].X / 2.0;
    }
    else {
      local_4d0 = *(double *)((long)pos_local[0x23].X + 0x68);
    }
    eyez = local_4d0;
    viewheight._6_1_ = false;
    viewheight._7_1_ = 0;
    if (newsec->heightsec != (sector_t_conflict *)0x0) {
      local_4d0 = _oldside + local_4d0;
      local_120 = local_4d0;
      dVar15 = secplane_t::ZatPoint(&newsec->heightsec->floorplane,(AActor *)pos_local);
      dVar14 = local_120;
      viewheight._7_1_ = dVar15 < local_4d0;
      dVar15 = secplane_t::ZatPoint(&newsec->heightsec->ceilingplane,(AActor *)pos_local);
      viewheight._6_1_ = dVar15 < dVar14;
    }
    TFlags<ActorBounceFlag,_unsigned_short>::operator&
              (&local_122,
               (int)pos_local +
               (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|BOUNCE_Actors));
    uVar5 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_122);
    bVar3 = false;
    if (uVar5 != 0) {
      pDVar2 = pos_local + 0x1b;
      operator|((EnumType)local_12c,MF_MISSILE);
      TFlags<ActorFlag,_unsigned_int>::operator&(&local_128,(Self *)((long)&pDVar2->Y + 4));
      uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_128);
      bVar3 = false;
      if (uVar7 == 0) {
        bVar4 = AActor::IsSentient((AActor *)pos_local);
        bVar3 = false;
        if (!bVar4) {
          dVar14 = pFStack_38->floorz;
          dVar15 = AActor::Z((AActor *)pos_local);
          bVar3 = 16.0 < dVar14 - dVar15;
        }
      }
    }
    if (bVar3) {
      operator~((EnumType)&local_130);
      TFlags<ActorFlag6,_unsigned_int>::operator&=
                ((TFlags<ActorFlag6,_unsigned_int> *)(pos_local + 0x1d),&local_130);
      thing_local._7_1_ = false;
    }
    else {
      bVar3 = false;
      do {
        besthit.Refpos.Y = 1.1;
        spechit_t::spechit_t((spechit_t *)&i);
        for (spec._0_4_ = 0; uVar7 = TArray<spechit_t,_spechit_t>::Size(&portalhit),
            (uint)spec < uVar7; spec._0_4_ = (uint)spec + 1) {
          psVar13 = TArray<spechit_t,_spechit_t>::operator[](&portalhit,(ulong)(uint)spec);
          dl2.dy = (double)psVar13->line;
          if (((line_t_conflict *)dl2.dy)->frontsector->PortalGroup ==
              *(int *)((long)pos_local[0x13].X + 0x208)) {
            oldsec._0_4_ = P_PointOnLineSide(&psVar13->Oldrefpos,(line_t_conflict *)dl2.dy);
            oldsec._4_4_ = P_PointOnLineSide(&psVar13->Refpos,(line_t_conflict *)dl2.dy);
            if (((int)oldsec == 0) && (oldsec._4_4_ == 1)) {
              local_1b0._16_8_ = vertex_t::fX(*(vertex_t **)dl2.dy);
              dl2.x = vertex_t::fY(*(vertex_t **)dl2.dy);
              line_t::Delta((line_t *)local_1b0);
              dl2.y = (double)local_1b0._0_8_;
              line_t::Delta((line_t *)&dl1.dy);
              frac = (psVar13->Oldrefpos).X;
              dl1.x = (psVar13->Oldrefpos).Y;
              dl1.y = (psVar13->Refpos).X - (psVar13->Oldrefpos).X;
              dl1.dx = (psVar13->Refpos).Y - (psVar13->Oldrefpos).Y;
              dVar14 = P_InterceptVector((divline_t *)&frac,(divline_t *)(local_1b0 + 0x10));
              if (dVar14 < besthit.Refpos.Y) {
                spechit_t::operator=((spechit_t *)&i,psVar13);
                spec._4_4_ = (uint)spec;
                besthit.Refpos.Y = dVar14;
              }
            }
          }
        }
        if (1.1 <= besthit.Refpos.Y) break;
        TArray<spechit_t,_spechit_t>::Delete(&portalhit,spec._4_4_);
        src = _i;
        ctx.render_list = (msecnode_t *)line_t::getPortal((line_t *)_i);
        if (((FLinePortal *)ctx.render_list)->mType == '\x03') {
          FLinkContext::FLinkContext((FLinkContext *)local_208);
          AActor::UnlinkFromWorld((AActor *)pos_local,(FLinkContext *)local_208);
          pDVar2 = pos_local;
          operator+((TVector3<double> *)&pos_1.Z,&pFStack_38->pos,
                    (Vector2 *)&(ctx.render_list)->m_tprev);
          TVector2<double>::TVector2(&local_218,(TVector3<double> *)&pos_1.Z);
          AActor::SetXY((AActor *)pDVar2,&local_218);
          TVector3<double>::operator+=
                    ((TVector3<double> *)(pos_local + 0x48),(Vector2 *)&(ctx.render_list)->m_tprev);
          AActor::LinkToWorld((AActor *)pos_local,(FLinkContext *)local_208,false,(sector_t *)0x0);
          P_FindFloorCeiling((AActor *)pos_local,0);
          bVar3 = true;
          pFStack_38->portalstep = false;
        }
        else if (!bVar3) {
          TVector2<double>::TVector2((TVector2<double> *)&oldthingpos.Z,&pFStack_38->pos);
          dVar14 = AActor::Z((AActor *)pos_local);
          TVector3<double>::TVector3((TVector3<double> *)local_248,(Vector2 *)&oldthingpos.Z,dVar14)
          ;
          AActor::Pos((DVector3 *)&thingpos.Y,(AActor *)pos_local);
          TVector2<double>::TVector2((TVector2<double> *)local_280,(TVector3<double> *)&thingpos.Y);
          P_TranslatePortalXY((line_t_conflict *)src,(double *)local_248,&pos_1.X);
          P_TranslatePortalXY((line_t_conflict *)src,(double *)local_280,&thingpos.X);
          P_TranslatePortalZ((line_t_conflict *)src,&pos_1.Y);
          AActor::SetXYZ((AActor *)pos_local,(double)local_280,thingpos.X,pos_1.Y);
          pDVar2 = pos_local;
          TVector2<double>::TVector2(&local_290,(TVector3<double> *)local_248);
          bVar3 = P_CheckPosition((AActor *)pDVar2,&local_290,true);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            AActor::SetXYZ((AActor *)pos_local,(DVector3 *)&thingpos.Y);
            operator~((int)&ctx_1 + (MF6_FORCEPAIN|MF6_MTHRUSPECIES));
            TFlags<ActorFlag6,_unsigned_int>::operator&=
                      ((TFlags<ActorFlag6,_unsigned_int> *)(pos_local + 0x1d),
                       (Self *)((long)&ctx_1.render_list + 4));
            return false;
          }
          FLinkContext::FLinkContext((FLinkContext *)&dl1_1.dy);
          AActor::UnlinkFromWorld((AActor *)pos_local,(FLinkContext *)&dl1_1.dy);
          AActor::SetXYZ((AActor *)pos_local,(DVector3 *)local_248);
          P_TranslatePortalVXVY((line_t_conflict *)src,&pos_local[0xc].Y,&pos_local[0xd].X);
          P_TranslatePortalAngle((line_t_conflict *)src,(DAngle *)(pos_local + 0xb));
          AActor::LinkToWorld((AActor *)pos_local,(FLinkContext *)&dl1_1.dy,false,(sector_t *)0x0);
          P_FindFloorCeiling((AActor *)pos_local,0);
          AActor::ClearInterpolation((AActor *)pos_local);
          bVar3 = true;
          pFStack_38->portalstep = false;
        }
        pDVar2 = pos_local;
        pAVar10 = TObjPtr::operator_cast_to_AActor_
                            ((TObjPtr *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
        if ((AActor *)pDVar2 == pAVar10) {
          hit.angle.Degrees = (double)besthit.line;
          dl1_1.x = besthit.Oldrefpos.X;
          dl1_1.y = besthit.Oldrefpos.Y - (double)besthit.line;
          dl1_1.dx = besthit.Refpos.X - besthit.Oldrefpos.X;
          TVector3<double>::TVector3
                    ((TVector3<double> *)&ctx_2.render_list,
                     (double)besthit.line + dl1_1.y * besthit.Refpos.Y,
                     besthit.Oldrefpos.X + dl1_1.dx * besthit.Refpos.Y,0.0);
          TAngle<double>::TAngle((TAngle<double> *)&hit.pos.Z,0.0);
          R_AddInterpolationPoint((DVector3a *)&ctx_2.render_list);
          if (*(char *)&(ctx.render_list)->m_sprev == '\x03') {
            ctx_2.render_list =
                 (msecnode_t *)((double)(ctx.render_list)->m_tprev + (double)ctx_2.render_list);
            hit.pos.X = (double)(ctx.render_list)->m_tnext + hit.pos.X;
          }
          else {
            P_TranslatePortalXY((line_t_conflict *)src,(double *)&ctx_2.render_list,(double *)&hit);
            P_TranslatePortalZ((line_t_conflict *)src,&hit.pos.Y);
            *(double *)(&DAT_01ae7120 + (long)consoleplayer * 0x2a0) =
                 hit.pos.Y + *(double *)(&DAT_01ae7120 + (long)consoleplayer * 0x2a0);
            P_TranslatePortalAngle((line_t_conflict *)src,(DAngle *)&hit.pos.Z);
          }
          R_AddInterpolationPoint((DVector3a *)&ctx_2.render_list);
        }
      } while (*(char *)&(ctx.render_list)->m_sprev == '\x03');
      if (!bVar3) {
        FLinkContext::FLinkContext((FLinkContext *)local_2f8);
        AActor::UnlinkFromWorld((AActor *)pos_local,(FLinkContext *)local_2f8);
        oldz = pos_local[0x13].X;
        pos_local[0x14].X = pFStack_38->floorz;
        pos_local[0x14].Y = pFStack_38->ceilingz;
        pos_local[0x15].X = pFStack_38->dropoffz;
        *(int *)&pos_local[0x16].X = (pFStack_38->floorpic).texnum;
        *(int *)((long)&pos_local[0x16].X + 4) = pFStack_38->floorterrain;
        pos_local[0x15].Y = (double)pFStack_38->floorsector;
        *(int *)&pos_local[0x17].X = (pFStack_38->ceilingpic).texnum;
        pos_local[0x16].Y = (double)pFStack_38->ceilingsector;
        AActor::SetXY((AActor *)pos_local,pDStack_20);
        AActor::LinkToWorld((AActor *)pos_local,(FLinkContext *)local_2f8,false,(sector_t *)0x0);
      }
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_2fc,(int)pos_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2fc);
      if (uVar7 != 0) {
        AActor::AdjustFloorClip((AActor *)pos_local);
      }
      pDVar2 = pos_local + 0x1b;
      operator|((int)&spec_1 + (MF_AMBUSH|MF_SHOOTABLE),MF_TELEPORT);
      TFlags<ActorFlag,_unsigned_int>::operator&(&local_300,(Self *)((long)&pDVar2->Y + 4));
      uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_300);
      if (uVar7 == 0) {
        spechit_t::spechit_t((spechit_t *)&lastpos.Y);
        AActor::Pos((DVector3 *)&ld_2,(AActor *)pos_local);
        TVector2<double>::TVector2((TVector2<double> *)local_340,(TVector3<double> *)&ld_2);
        while (bVar3 = TArray<spechit_t,_spechit_t>::Pop(&spechit,(spechit_t *)&lastpos.Y), bVar3) {
          local_360 = (line_t_conflict *)lastpos.Y;
          oldsec._4_4_ = P_PointOnLineSide((DVector2 *)&spec_1.Oldrefpos.Y,
                                           (line_t_conflict *)lastpos.Y);
          oldsec._0_4_ = P_PointOnLineSide((DVector2 *)&spec_1,local_360);
          bVar3 = false;
          if ((oldsec._4_4_ != (int)oldsec) && (bVar3 = false, local_360->special != 0)) {
            TFlags<ActorFlag6,_unsigned_int>::operator&
                      (&local_364,
                       (int)pos_local +
                       (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
            uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_364);
            bVar3 = uVar7 == 0;
          }
          if (bVar3) {
            if ((pos_local[0x23].X == 0.0) ||
               ((*(uint *)((long)pos_local[0x23].X + 0xe8) & 0x2000) == 0)) {
              if (pos_local[0x23].X == 0.0) {
                TFlags<ActorFlag2,_unsigned_int>::operator&
                          (&local_368,(int)pos_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
                uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_368);
                if (uVar7 == 0) {
                  TFlags<ActorFlag2,_unsigned_int>::operator&
                            ((TFlags<ActorFlag2,_unsigned_int> *)((long)&hs + 4),
                             (int)pos_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
                  uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&hs + 4));
                  if (uVar7 == 0) {
                    if (((local_360->special == 0x46) || (local_360->special == 0x47)) ||
                       (local_360->special == 0xd7)) {
                      P_ActivateLine(local_360,(AActor *)pos_local,(int)oldsec,4,(DVector3 *)0x0);
                    }
                    else {
                      P_ActivateLine(local_360,(AActor *)pos_local,(int)oldsec,0x80,(DVector3 *)0x0)
                      ;
                    }
                  }
                  else {
                    P_ActivateLine(local_360,(AActor *)pos_local,(int)oldsec,0x20,(DVector3 *)0x0);
                  }
                }
                else {
                  P_ActivateLine(local_360,(AActor *)pos_local,(int)oldsec,4,(DVector3 *)0x0);
                }
              }
              else {
                P_ActivateLine(local_360,(AActor *)pos_local,(int)oldsec,1,(DVector3 *)0x0);
              }
            }
            else {
              P_PredictLine(local_360,(AActor *)pos_local,(int)oldsec,1);
            }
          }
        }
      }
      if ((pos_local[0x23].X == 0.0) || ((*(uint *)((long)pos_local[0x23].X + 0xe8) & 0x2000) == 0))
      {
        BlockingMobj = (AActor *)pos_local[0x13].X;
        if ((*(long *)&BlockingMobj->DamageVal != 0) &&
           ((newsec->heightsec != (sector_t_conflict *)0x0 &&
            (pAVar11 = TObjPtr::operator_cast_to_ASectorAction_
                                 ((TObjPtr *)&BlockingMobj->weaponspecial),
            pAVar11 != (ASectorAction *)0x0)))) {
          lVar1 = *(long *)&BlockingMobj->DamageVal;
          dVar14 = AActor::Z((AActor *)pos_local);
          dVar14 = dVar14 + eyez;
          dVar15 = secplane_t::ZatPoint((secplane_t *)(lVar1 + 0xb0),pDStack_20);
          if (((viewheight._7_1_ & 1) != 0) || (dVar14 <= dVar15)) {
            if (((viewheight._7_1_ & 1) != 0) && (dVar14 <= dVar15)) {
              pAVar11 = TObjPtr<ASectorAction>::operator->
                                  ((TObjPtr<ASectorAction> *)&BlockingMobj->weaponspecial);
              ASectorAction::TriggerAction(pAVar11,(AActor *)pos_local,0x40);
            }
          }
          else {
            pAVar11 = TObjPtr<ASectorAction>::operator->
                                ((TObjPtr<ASectorAction> *)&BlockingMobj->weaponspecial);
            ASectorAction::TriggerAction(pAVar11,(AActor *)pos_local,0x80);
          }
          if ((*(ushort *)(lVar1 + 0x1ee) & 2) == 0) {
            dVar15 = secplane_t::ZatPoint((secplane_t *)(lVar1 + 0xd8),pDStack_20);
            if (((viewheight._6_1_ & 1) != 0) || (dVar14 <= dVar15)) {
              if (((viewheight._6_1_ & 1) != 0) && (dVar14 <= dVar15)) {
                pAVar11 = TObjPtr<ASectorAction>::operator->
                                    ((TObjPtr<ASectorAction> *)&BlockingMobj->weaponspecial);
                ASectorAction::TriggerAction(pAVar11,(AActor *)pos_local,0x100);
              }
            }
            else {
              pAVar11 = TObjPtr<ASectorAction>::operator->
                                  ((TObjPtr<ASectorAction> *)&BlockingMobj->weaponspecial);
              ASectorAction::TriggerAction(pAVar11,(AActor *)pos_local,0x200);
            }
          }
        }
        if ((pFStack_38->portalstep & 1U) != 0) {
          FLinkContext::FLinkContext((FLinkContext *)&oldpos.Z);
          AActor::Pos((DVector3 *)local_3b0,(AActor *)pos_local);
          AActor::UnlinkFromWorld((AActor *)pos_local,(FLinkContext *)&oldpos.Z);
          pDVar2 = pos_local;
          iVar6 = sector_t::GetOppositePortalGroup((sector_t *)pos_local[0x13].X,1);
          AActor::PosRelative(&local_3c8,(AActor *)pDVar2,iVar6);
          AActor::SetXYZ((AActor *)pDVar2,&local_3c8);
          AActor::Pos(&local_3f8,(AActor *)pos_local);
          TVector3<double>::operator-(&local_3e0,&local_3f8,(TVector3<double> *)local_3b0);
          TVector3<double>::operator=((TVector3<double> *)(pos_local + 0x48),&local_3e0);
          AActor::Pos(&local_420,(AActor *)pos_local);
          TVector2<double>::TVector2(&local_408,&local_420);
          psVar12 = P_PointInSector(&local_408);
          pos_local[0x13].X = (double)psVar12;
          *(undefined4 *)&pos_local[0x4b].Y = *(undefined4 *)((long)pos_local[0x13].X + 0x208);
          AActor::LinkToWorld((AActor *)pos_local,(FLinkContext *)&oldpos.Z,false,(sector_t *)0x0);
          P_FindFloorCeiling((AActor *)pos_local,0);
        }
        AActor::CheckSectorTransition((AActor *)pos_local,(sector_t *)newsec);
        operator~((EnumType)&local_424);
        TFlags<ActorFlag6,_unsigned_int>::operator&=
                  ((TFlags<ActorFlag6,_unsigned_int> *)(pos_local + 0x1d),&local_424);
        thing_local._7_1_ = true;
      }
      else {
        operator~((EnumType)&hs);
        TFlags<ActorFlag6,_unsigned_int>::operator&=
                  ((TFlags<ActorFlag6,_unsigned_int> *)(pos_local + 0x1d),(Self *)&hs);
        thing_local._7_1_ = true;
      }
    }
  }
  return thing_local._7_1_;
}

Assistant:

bool P_TryMove(AActor *thing, const DVector2 &pos,
	int dropoff, // killough 3/15/98: allow dropoff as option
	const secplane_t *onfloor, // [RH] Let P_TryMove keep the thing on the floor
	FCheckPosition &tm,
	bool missileCheck)	// [GZ] Fired missiles ignore the drop-off test
{
	sector_t	*oldsector;
	double		oldz;
	int 		side;
	int 		oldside;
	sector_t*	oldsec = thing->Sector;	// [RH] for sector actions
	sector_t*	newsec;

	tm.floatok = false;
	tm.portalstep = false;
	oldz = thing->Z();
	if (onfloor)
	{
		thing->SetZ(onfloor->ZatPoint(pos));
	}
	thing->flags6 |= MF6_INTRYMOVE;
	if (!P_CheckPosition(thing, pos, tm))
	{
		AActor *BlockingMobj = thing->BlockingMobj;
		// Solid wall or thing
		if (!BlockingMobj || BlockingMobj->player || !thing->player)
		{
			goto pushline;
		}
		else
		{
			if (BlockingMobj->player || !thing->player)
			{
				goto pushline;
			}
			else if (BlockingMobj->Top() - thing->Z() > thing->MaxStepHeight
				|| ((BlockingMobj->Sector->ceilingplane.ZatPoint(pos) - (BlockingMobj->Top()) < thing->Height) && BlockingMobj->Sector->PortalBlocksMovement(sector_t::ceiling))
				|| (tm.ceilingz - (BlockingMobj->Top()) < thing->Height))
			{
				goto pushline;
			}
		}
		if (!(tm.thing->flags2 & MF2_PASSMOBJ) || (i_compatflags & COMPATF_NO_PASSMOBJ))
		{
			thing->SetZ(oldz);
			thing->flags6 &= ~MF6_INTRYMOVE;
			return false;
		}
	}

	if (thing->flags3 & MF3_FLOORHUGGER)
	{
		thing->SetZ(tm.floorz);
	}
	else if (thing->flags3 & MF3_CEILINGHUGGER)
	{
		thing->SetZ(tm.ceilingz - thing->Height);
	}

	if (onfloor && tm.floorsector == thing->floorsector)
	{
		thing->SetZ(tm.floorz);
	}
	if (!(thing->flags & MF_NOCLIP))
	{
		if (tm.ceilingz - tm.floorz < thing->Height)
		{
			goto pushline;		// doesn't fit
		}

		tm.floatok = true;

		if (!(thing->flags & MF_TELEPORT)
			&& tm.ceilingz < thing->Top()
			&& !(thing->flags3 & MF3_CEILINGHUGGER)
			&& (!(thing->flags2 & MF2_FLY) || !(thing->flags & MF_NOGRAVITY)))
		{
			goto pushline;		// mobj must lower itself to fit
		}
		if (thing->flags2 & MF2_FLY && thing->flags & MF_NOGRAVITY)
		{
#if 1
			if (thing->Top() > tm.ceilingz)
				goto pushline;
#else
			// When flying, slide up or down blocking lines until the actor
			// is not blocked.
			if (thing->Top() > tm.ceilingz)
			{
				thing->Vel.Z = -8;
				goto pushline;
			}
			else if (thing->Z() < tm.floorz && tm.floorz - tm.dropoffz > thing->MaxDropOffHeight)
			{
				thing->Vel.Z = 8;
				goto pushline;
			}
#endif
		}
		if (!(thing->flags & MF_TELEPORT) && !(thing->flags3 & MF3_FLOORHUGGER))
		{
			if ((thing->flags & MF_MISSILE) && !(thing->flags6 & MF6_STEPMISSILE) && tm.floorz > thing->Z())
			{ // [RH] Don't let normal missiles climb steps
				goto pushline;
			}
			if (tm.floorz - thing->Z() > thing->MaxStepHeight)
			{ // too big a step up
				goto pushline;
			}
			else if (thing->Z() < tm.floorz)
			{ // [RH] Check to make sure there's nothing in the way for the step up
				double savedz = thing->Z();
				bool good;
				thing->SetZ(tm.floorz);
				good = P_TestMobjZ(thing);
				thing->SetZ(savedz);
				if (!good)
				{
					goto pushline;
				}
				if (thing->flags6 & MF6_STEPMISSILE)
				{
					thing->SetZ(tm.floorz);
					// If moving down, cancel vertical component of the velocity
					if (thing->Vel.Z < 0)
					{
						// If it's a bouncer, let it bounce off its new floor, too.
						if (thing->BounceFlags & BOUNCE_Floors)
						{
							thing->FloorBounceMissile(tm.floorsector->floorplane);
						}
						else
						{
							thing->Vel.Z = 0;
						}
					}
				}
			}
		}

		// compatibility check: Doom originally did not allow monsters to cross dropoffs at all.
		// If the compatibility flag is on, only allow this when the velocity comes from a scroller
		if ((i_compatflags & COMPATF_CROSSDROPOFF) && !(thing->flags4 & MF4_SCROLLMOVE))
		{
			dropoff = false;
		}

		if (dropoff == 2 &&  // large jump down (e.g. dogs)
			(tm.floorz - tm.dropoffz > 128. || thing->target == NULL || thing->target->Z() >tm.dropoffz))
		{
			dropoff = false;
		}


		// killough 3/15/98: Allow certain objects to drop off
		if ((!dropoff && !(thing->flags & (MF_DROPOFF | MF_FLOAT | MF_MISSILE))) || (thing->flags5&MF5_NODROPOFF))
		{
			if (!(thing->flags5&MF5_AVOIDINGDROPOFF))
			{
				double floorz = tm.floorz;
				// [RH] If the thing is standing on something, use its current z as the floorz.
				// This is so that it does not walk off of things onto a drop off.
				if (thing->flags2 & MF2_ONMOBJ)
				{
					floorz = MAX(thing->Z(), tm.floorz);
				}

				if (floorz - tm.dropoffz > thing->MaxDropOffHeight &&
					!(thing->flags2 & MF2_BLASTED) && !missileCheck)
				{ // Can't move over a dropoff unless it's been blasted
					// [GZ] Or missile-spawned
					thing->SetZ(oldz);
					thing->flags6 &= ~MF6_INTRYMOVE;
					return false;
				}
			}
			else
			{
				// special logic to move a monster off a dropoff
				// this intentionally does not check for standing on things.
				if (thing->floorz - tm.floorz > thing->MaxDropOffHeight ||
					thing->dropoffz - tm.dropoffz > thing->MaxDropOffHeight)
				{
					thing->flags6 &= ~MF6_INTRYMOVE;
					return false;
				}
			}
		}
		if (thing->flags2 & MF2_CANTLEAVEFLOORPIC
			&& (tm.floorpic != thing->floorpic
			|| tm.floorz - thing->Z() != 0))
		{ // must stay within a sector of a certain floor type
			thing->SetZ(oldz);
			thing->flags6 &= ~MF6_INTRYMOVE;
			return false;
		}

		//Added by MC: To prevent bot from getting into dangerous sectors.
		if (thing->player && thing->player->Bot != NULL && thing->flags & MF_SHOOTABLE)
		{
			if (tm.sector != thing->Sector
				&& bglobal.IsDangerous(tm.sector))
			{
				thing->player->Bot->prev = thing->player->Bot->dest;
				thing->player->Bot->dest = NULL;
				thing->Vel.X = thing->Vel.Y = 0;
				thing->SetZ(oldz);
				thing->flags6 &= ~MF6_INTRYMOVE;
				return false;
			}
		}
	}

	// [RH] Check status of eyes against fake floor/ceiling in case
	// it slopes or the player's eyes are bobbing in and out.

	bool oldAboveFakeFloor, oldAboveFakeCeiling;
	double viewheight;
	// pacify GCC
	viewheight = thing->player ? thing->player->viewheight : thing->Height / 2;
	oldAboveFakeFloor = oldAboveFakeCeiling = false;

	if (oldsec->heightsec)
	{
		double eyez = oldz + viewheight;

		oldAboveFakeFloor = eyez > oldsec->heightsec->floorplane.ZatPoint(thing);
		oldAboveFakeCeiling = eyez > oldsec->heightsec->ceilingplane.ZatPoint(thing);
	}

	// Borrowed from MBF: 
	if (thing->BounceFlags & BOUNCE_MBF &&  // killough 8/13/98
		!(thing->flags & (MF_MISSILE | MF_NOGRAVITY)) &&
		!thing->IsSentient() && tm.floorz - thing->Z() > 16)
	{ // too big a step up for MBF bouncers under gravity
		thing->flags6 &= ~MF6_INTRYMOVE;
		return false;
	}


	// Check for crossed portals
	bool portalcrossed;
	portalcrossed = false;

	while (true)
	{
		double bestfrac = 1.1;
		spechit_t besthit;
		int besthitnum;
		// find the portal nearest to the crossing actor
		for (unsigned i = 0; i < portalhit.Size();i++)
		{
			auto &spec = portalhit[i];

			line_t *ld = spec.line;
			if (ld->frontsector->PortalGroup != thing->Sector->PortalGroup) continue;	// must be in the same group to be considered valid.

			// see if the line was crossed
			oldside = P_PointOnLineSide(spec.Oldrefpos, ld);
			side = P_PointOnLineSide(spec.Refpos, ld);
			if (oldside == 0 && side == 1)
			{
				divline_t dl2 = { ld->v1->fX(), ld->v1->fY(), ld->Delta().X, ld->Delta().Y };
				divline_t dl1 = { spec.Oldrefpos.X, spec.Oldrefpos.Y, spec.Refpos.X - spec.Oldrefpos.X, spec.Refpos.Y - spec.Oldrefpos.Y };
				double frac = P_InterceptVector(&dl1, &dl2);
				if (frac < bestfrac)
				{
					besthit = spec;
					bestfrac = frac;
					besthitnum = i;
				}
			}
		}

		if (bestfrac < 1.1)
		{
			portalhit.Delete(besthitnum);
			line_t *ld = besthit.line;
			FLinePortal *port = ld->getPortal();
			if (port->mType == PORTT_LINKED)
			{
				FLinkContext ctx;
				thing->UnlinkFromWorld(&ctx);
				thing->SetXY(tm.pos + port->mDisplacement);
				thing->Prev += port->mDisplacement;
				thing->LinkToWorld(&ctx);
				P_FindFloorCeiling(thing);
				portalcrossed = true;
				tm.portalstep = false;
			}
			else if (!portalcrossed)
			{
				DVector3 pos(tm.pos, thing->Z());
				DVector3 oldthingpos = thing->Pos();
				DVector2 thingpos = oldthingpos;
				
				P_TranslatePortalXY(ld, pos.X, pos.Y);
				P_TranslatePortalXY(ld, thingpos.X, thingpos.Y);
				P_TranslatePortalZ(ld, pos.Z);
				thing->SetXYZ(thingpos.X, thingpos.Y, pos.Z);
				if (!P_CheckPosition(thing, pos, true))	// check if some actor blocks us on the other side. (No line checks, because of the mess that'd create.)
				{
					thing->SetXYZ(oldthingpos);
					thing->flags6 &= ~MF6_INTRYMOVE;
					return false;
				}
				FLinkContext ctx;
				thing->UnlinkFromWorld(&ctx);
				thing->SetXYZ(pos);
				P_TranslatePortalVXVY(ld, thing->Vel.X, thing->Vel.Y);
				P_TranslatePortalAngle(ld, thing->Angles.Yaw);
				thing->LinkToWorld(&ctx);
				P_FindFloorCeiling(thing);
				thing->ClearInterpolation();
				portalcrossed = true;
				tm.portalstep = false;
			}
			// if this is the current camera we need to store the point where the portal was crossed and the exit
			// so that the renderer can properly calculate an interpolated position along the movement path.
			if (thing == players[consoleplayer].camera)
			{
				divline_t dl1 = { besthit.Oldrefpos.X,besthit.Oldrefpos.Y, besthit.Refpos.X - besthit.Oldrefpos.X, besthit.Refpos.Y - besthit.Oldrefpos.Y };
				DVector3a hit = { {dl1.x + dl1.dx * bestfrac, dl1.y + dl1.dy * bestfrac, 0.},0. };

				R_AddInterpolationPoint(hit);
				if (port->mType == PORTT_LINKED)
				{
					hit.pos.X += port->mDisplacement.X;
					hit.pos.Y += port->mDisplacement.Y;
				}
				else
				{
					P_TranslatePortalXY(ld, hit.pos.X, hit.pos.Y);
					P_TranslatePortalZ(ld, hit.pos.Z);
					players[consoleplayer].viewz += hit.pos.Z;	// needs to be done here because otherwise the renderer will not catch the change.
					P_TranslatePortalAngle(ld, hit.angle);
				}
				R_AddInterpolationPoint(hit);
			}
			if (port->mType == PORTT_LINKED)
			{
				continue;
		}
		}
		break;
	}



	if (!portalcrossed)
	{
		// the move is ok, so link the thing into its new position
		FLinkContext ctx;
		thing->UnlinkFromWorld(&ctx);

		oldsector = thing->Sector;
		thing->floorz = tm.floorz;
		thing->ceilingz= tm.ceilingz;
		thing->dropoffz = tm.dropoffz;		// killough 11/98: keep track of dropoffs
		thing->floorpic = tm.floorpic;
		thing->floorterrain = tm.floorterrain;
		thing->floorsector = tm.floorsector;
		thing->ceilingpic = tm.ceilingpic;
		thing->ceilingsector = tm.ceilingsector;
		thing->SetXY(pos);

		thing->LinkToWorld(&ctx);
	}

	if (thing->flags2 & MF2_FLOORCLIP)
	{
		thing->AdjustFloorClip();
	}

	// if any special lines were hit, do the effect
	if (!(thing->flags & (MF_TELEPORT | MF_NOCLIP)))
	{
		spechit_t spec;
		DVector2 lastpos = thing->Pos();
		while (spechit.Pop(spec))
		{
			line_t *ld = spec.line;
			// see if the line was crossed

			side = P_PointOnLineSide(spec.Refpos, ld);
			oldside = P_PointOnLineSide(spec.Oldrefpos, ld);
			if (side != oldside && ld->special && !(thing->flags6 & MF6_NOTRIGGER))
			{
				if (thing->player && (thing->player->cheats & CF_PREDICTING))
				{
					P_PredictLine(ld, thing, oldside, SPAC_Cross);
				}
				else if (thing->player)
				{
					P_ActivateLine(ld, thing, oldside, SPAC_Cross);
				}
				else if (thing->flags2 & MF2_MCROSS)
				{
					P_ActivateLine(ld, thing, oldside, SPAC_MCross);
				}
				else if (thing->flags2 & MF2_PCROSS)
				{
					P_ActivateLine(ld, thing, oldside, SPAC_PCross);
				}
				else if ((ld->special == Teleport ||
					ld->special == Teleport_NoFog ||
					ld->special == Teleport_Line))
				{	// [RH] Just a little hack for BOOM compatibility
					P_ActivateLine(ld, thing, oldside, SPAC_MCross);
				}
				else
				{
					P_ActivateLine(ld, thing, oldside, SPAC_AnyCross);
				}
			}
		}
	}

	// [RH] Don't activate anything if just predicting
	if (thing->player && (thing->player->cheats & CF_PREDICTING))
	{
		thing->flags6 &= ~MF6_INTRYMOVE;
		return true;
	}

	// [RH] Check for crossing fake floor/ceiling
	newsec = thing->Sector;
	if (newsec->heightsec && oldsec->heightsec && newsec->SecActTarget)
	{
		const sector_t *hs = newsec->heightsec;
		double eyez = thing->Z() + viewheight;
		double fakez = hs->floorplane.ZatPoint(pos);

		if (!oldAboveFakeFloor && eyez > fakez)
		{ // View went above fake floor
			newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesSurface);
		}
		else if (oldAboveFakeFloor && eyez <= fakez)
		{ // View went below fake floor
			newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesDive);
		}

		if (!(hs->MoreFlags & SECF_FAKEFLOORONLY))
		{
			fakez = hs->ceilingplane.ZatPoint(pos);
			if (!oldAboveFakeCeiling && eyez > fakez)
			{ // View went above fake ceiling
				newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesAboveC);
			}
			else if (oldAboveFakeCeiling && eyez <= fakez)
			{ // View went below fake ceiling
				newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesBelowC);
			}
		}
	}

	// If the actor stepped through a ceiling portal we need to reacquire the actual position info after the transition
	if (tm.portalstep)
	{
		FLinkContext ctx;
		DVector3 oldpos = thing->Pos();
		thing->UnlinkFromWorld(&ctx);
		thing->SetXYZ(thing->PosRelative(thing->Sector->GetOppositePortalGroup(sector_t::ceiling)));
		thing->Prev = thing->Pos() - oldpos;
		thing->Sector = P_PointInSector(thing->Pos());
		thing->PrevPortalGroup = thing->Sector->PortalGroup;
		thing->LinkToWorld(&ctx);

		P_FindFloorCeiling(thing);
	}

	// [RH] If changing sectors, trigger transitions
	thing->CheckSectorTransition(oldsec);
	thing->flags6 &= ~MF6_INTRYMOVE;
	return true;

pushline:
	thing->flags6 &= ~MF6_INTRYMOVE;

	// [RH] Don't activate anything if just predicting
	if (thing->player && (thing->player->cheats & CF_PREDICTING))
	{
		return false;
	}

	thing->SetZ(oldz);
	if (!(thing->flags&(MF_TELEPORT | MF_NOCLIP)))
	{
		int numSpecHitTemp;

		if (tm.thing->flags2 & MF2_BLASTED)
		{
			P_DamageMobj(tm.thing, NULL, NULL, tm.thing->Mass >> 5, NAME_Melee);
		}
		numSpecHitTemp = (int)spechit.Size();
		while (numSpecHitTemp > 0)
		{
			// see which lines were pushed
			spechit_t &spec = spechit[--numSpecHitTemp];
			side = P_PointOnLineSide(spec.Refpos, spec.line);
			CheckForPushSpecial(spec.line, side, thing, &spec.Refpos);
		}
	}
	return false;
}